

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Type __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::generateSupertype
          (HeapTypeGeneratorImpl *this,Type type)

{
  TypeBuilder *pTVar1;
  bool bVar2;
  undefined4 uVar3;
  ulong uVar4;
  size_type __n;
  uintptr_t *puVar5;
  undefined8 uVar6;
  Iterator IVar7;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar8;
  Ref RVar9;
  Ref ref;
  value_type local_80;
  uintptr_t local_78;
  Type t;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  undefined1 local_38 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  HeapTypeGeneratorImpl *this_local;
  Type type_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  this_local = (HeapTypeGeneratorImpl *)type.id;
  uVar4 = ::wasm::Type::isTuple();
  if ((uVar4 & 1) == 0) {
    uVar4 = ::wasm::Type::isRef();
    if ((uVar4 & 1) == 0) {
      bVar2 = Type::isBasic((Type *)&this_local);
      if (!bVar2) {
        ::wasm::handle_unreachable
                  ("unexpected type kind",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,0x21c);
      }
      type_local.id = (uintptr_t)this_local;
    }
    else {
      uVar6 = ::wasm::Type::getHeapType();
      uVar3 = ::wasm::Type::getNullability();
      RVar9.nullability = uVar3;
      RVar9.type.id = uVar6;
      RVar9._12_4_ = 0;
      RVar9 = generateSuperRef(this,RVar9);
      ref.type.id._0_4_ = RVar9.nullability;
      type_local.id =
           ::wasm::TypeBuilder::getTempRefType((HeapType)this->builder,(Nullability)RVar9.type.id);
    }
  }
  else {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
    __n = ::wasm::Type::size();
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,__n);
    IVar7 = Type::begin((Type *)&this_local);
    __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar8 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end((Type *)&this_local);
    while( true ) {
      __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar8.index;
      t.id = (uintptr_t)PVar8.parent;
      bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t
                        );
      if (!bVar2) break;
      puVar5 = (uintptr_t *)
               ::wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end3.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      local_78 = *puVar5;
      local_80.id = (uintptr_t)generateSupertype(this,local_78);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,&local_80);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
      PVar8.index = (size_t)__end3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar8.parent = (Type *)t.id;
    }
    pTVar1 = this->builder;
    Tuple::Tuple((Tuple *)&ref.nullability,(TypeList *)local_38);
    type_local.id = ::wasm::TypeBuilder::getTempTupleType((Tuple *)pTVar1);
    Tuple::~Tuple((Tuple *)&ref.nullability);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  }
  return (Type)type_local.id;
}

Assistant:

Type generateSupertype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSupertype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSuperRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have supertypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }